

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SettingsHandlerWindow_ReadLine
               (ImGuiContext *ctx,ImGuiSettingsHandler *param_2,void *entry,char *line)

{
  int iVar1;
  ImVec2 IVar2;
  ImVec2 local_5c [2];
  ImVec2 local_4c;
  int local_44;
  float local_40;
  int i;
  float y;
  float x;
  ImGuiWindowSettings *settings;
  ImGuiContext *g;
  char *line_local;
  void *entry_local;
  ImGuiSettingsHandler *param_1_local;
  ImGuiContext *ctx_local;
  
  _y = entry;
  settings = (ImGuiWindowSettings *)ctx;
  g = (ImGuiContext *)line;
  line_local = (char *)entry;
  entry_local = param_2;
  param_1_local = (ImGuiSettingsHandler *)ctx;
  iVar1 = __isoc99_sscanf(line,"Pos=%f,%f",&i,&local_40);
  if (iVar1 == 2) {
    ImVec2::ImVec2(&local_4c,(float)i,local_40);
    *(ImVec2 *)((long)_y + 0xc) = local_4c;
  }
  else {
    iVar1 = __isoc99_sscanf(g,"Size=%f,%f",&i,&local_40);
    if (iVar1 == 2) {
      ImVec2::ImVec2(local_5c,(float)i,local_40);
      IVar2 = ImMax(local_5c,&settings[0xab].Pos);
      *(ImVec2 *)((long)_y + 0x14) = IVar2;
    }
    else {
      iVar1 = __isoc99_sscanf(g,"Collapsed=%d",&local_44);
      if (iVar1 == 1) {
        *(bool *)((long)_y + 0x1c) = local_44 != 0;
      }
    }
  }
  return;
}

Assistant:

static void SettingsHandlerWindow_ReadLine(ImGuiContext* ctx, ImGuiSettingsHandler*, void* entry, const char* line)
{
    ImGuiContext& g = *ctx;
    ImGuiWindowSettings* settings = (ImGuiWindowSettings*)entry;
    float x, y;
    int i;
    if (sscanf(line, "Pos=%f,%f", &x, &y) == 2)         settings->Pos = ImVec2(x, y);
    else if (sscanf(line, "Size=%f,%f", &x, &y) == 2)   settings->Size = ImMax(ImVec2(x, y), g.Style.WindowMinSize);
    else if (sscanf(line, "Collapsed=%d", &i) == 1)     settings->Collapsed = (i != 0);
}